

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O2

void R_SWRSetWindow(int windowSize,int fullWidth,int fullHeight,int stHeight,int trueratio)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  char temp [16];
  
  if (!bRenderingToCanvas) {
    mysnprintf(temp,0x10,"%d x %d",(ulong)(uint)viewwidth,(ulong)(uint)viewheight);
    FBaseCVar::ForceSet(&r_viewsize.super_FBaseCVar,(UCVarValue)temp,CVAR_String,false);
  }
  iVar1 = viewheight;
  fuzzviewheight = viewheight + -2;
  CenterX = (double)centerx;
  CenterY = (double)centery;
  if (trueratio == 4) {
    iVar5 = (fullHeight * 0x2d) / 0x30;
    iVar3 = fullWidth;
  }
  else {
    iVar3 = (BaseRatioSizes[trueratio][3] * fullWidth) / 0x30;
    iVar5 = fullHeight;
  }
  if ((long)WidescreenRatio == 4) {
    fullHeight = (fullHeight * 0x2d) / 0x30;
  }
  else {
    fullWidth = (fullWidth * BaseRatioSizes[WidescreenRatio][3]) / 0x30;
  }
  BaseYaspectMul = ((double)iVar5 * 320.0) / ((double)iVar3 * 200.0);
  YaspectMul = ((double)fullHeight * 320.0) / ((double)fullWidth * 200.0);
  IYaspectMul = ((double)fullWidth * 0.625) / (double)fullHeight;
  pspritexscale = (double)centerxwide * 0.00625;
  pspriteyscale = pspritexscale * YaspectMul;
  InvZtoScale = YaspectMul * CenterX;
  WallTMapScale2 = IYaspectMul / CenterX;
  pspritexiscale = 160.0 / (double)centerxwide;
  uVar2 = (ulong)(uint)viewwidth;
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    screenheightarray[uVar4] = (short)iVar1;
  }
  R_InitTextureMapping();
  MaxVisForWall =
       (FocalTangent * 32767.0 *
       (double)((screen->super_DSimpleCanvas).super_DCanvas.Height * viewwidth)) /
       (InvZtoScale * 200.0 * (double)(screen->super_DSimpleCanvas).super_DCanvas.Width);
  MaxVisForFloor = 5242720.0 / ((double)viewheight * FocalLengthY);
  R_SetVisibility(CurrentVisibility);
  return;
}

Assistant:

void R_SWRSetWindow(int windowSize, int fullWidth, int fullHeight, int stHeight, int trueratio)
{
	int virtheight, virtwidth, virtwidth2, virtheight2;

	if (!bRenderingToCanvas)
	{ // Set r_viewsize cvar to reflect the current view size
		UCVarValue value;
		char temp[16];

		mysnprintf (temp, countof(temp), "%d x %d", viewwidth, viewheight);
		value.String = temp;
		r_viewsize.ForceSet (value, CVAR_String);
	}

	fuzzviewheight = viewheight - 2;	// Maximum row the fuzzer can draw to

	lastcenteryfrac = 1<<30;
	CenterX = centerx;
	CenterY = centery;

	virtwidth = virtwidth2 = fullWidth;
	virtheight = virtheight2 = fullHeight;

	if (Is54Aspect(trueratio))
	{
		virtheight2 = virtheight2 * BaseRatioSizes[trueratio][3] / 48;
	}
	else
	{
		virtwidth2 = virtwidth2 * BaseRatioSizes[trueratio][3] / 48;
	}

	if (Is54Aspect(WidescreenRatio))
	{
		virtheight = virtheight * BaseRatioSizes[WidescreenRatio][3] / 48;
	}
	else
	{
		virtwidth = virtwidth * BaseRatioSizes[WidescreenRatio][3] / 48;
	}

	BaseYaspectMul = 320.0 * virtheight2 / (r_Yaspect * virtwidth2);
	YaspectMul = 320.0 * virtheight / (r_Yaspect * virtwidth);
	IYaspectMul = (double)virtwidth * r_Yaspect / 320.0 / virtheight;
	InvZtoScale = YaspectMul * CenterX;

	WallTMapScale2 = IYaspectMul / CenterX;

	// psprite scales
	pspritexscale = centerxwide / 160.0;
	pspriteyscale = pspritexscale * YaspectMul;
	pspritexiscale = 1 / pspritexscale;

	// thing clipping
	clearbufshort (screenheightarray, viewwidth, (short)viewheight);

	R_InitTextureMapping ();

	MaxVisForWall = (InvZtoScale * (SCREENWIDTH*r_Yaspect) /
		(viewwidth*SCREENHEIGHT * FocalTangent));
	MaxVisForWall = 32767.0 / MaxVisForWall;
	MaxVisForFloor = 32767.0 / (viewheight * FocalLengthY / 160);

	// Reset r_*Visibility vars
	R_SetVisibility(R_GetVisibility());
}